

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.cpp
# Opt level: O3

__pid_t __thiscall Signal::wait(Signal *this,void *__stat_loc)

{
  int64 *__mutex;
  char cVar1;
  code *pcVar2;
  int iVar3;
  
  __mutex = this->mdata;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((iVar3 == 0) ||
     (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Signal.cpp"
                            ,0x3f,"pthread_mutex_lock((pthread_mutex_t*)mdata) == 0"), iVar3 == 0))
  {
    cVar1 = this->signaled;
    while (cVar1 == '\0') {
      iVar3 = pthread_cond_wait((pthread_cond_t *)this,(pthread_mutex_t *)__mutex);
      if ((iVar3 != 0) &&
         (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Signal.cpp"
                                ,0x47,
                                "pthread_cond_wait((pthread_cond_t*)cdata, (pthread_mutex_t*)mdata) == 0"
                               ), iVar3 != 0)) goto LAB_0010ba71;
      cVar1 = this->signaled;
    }
    iVar3 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if ((iVar3 == 0) ||
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Signal.cpp"
                              ,0x44,"pthread_mutex_unlock((pthread_mutex_t*)mdata) == 0"),
       iVar3 == 0)) {
      return (__pid_t)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    }
  }
LAB_0010ba71:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

bool Signal::wait()
{
#ifdef _WIN32
  return WaitForSingleObject(handle, INFINITE) == WAIT_OBJECT_0;
#else
  VERIFY(pthread_mutex_lock((pthread_mutex_t*)mdata) == 0);
  for(;;)
  {
    if(signaled)
    {
      VERIFY(pthread_mutex_unlock((pthread_mutex_t*)mdata) == 0);
      return true;
    }
    VERIFY(pthread_cond_wait((pthread_cond_t*)cdata, (pthread_mutex_t*)mdata) == 0);
  }
#endif
}